

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<UnsignedLongLong> *this,char *name,CodeLocation *code_location
          )

{
  allocator local_19;
  
  (this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_0022b5b8;
  std::__cxx11::string::string((string *)&this->test_suite_name_,name,&local_19);
  CodeLocation::CodeLocation(&this->code_location_,code_location);
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(const char* name,
                                      CodeLocation code_location)
      : test_suite_name_(name), code_location_(code_location) {}